

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSpatialAlgebra.h
# Opt level: O0

btSpatialMotionVector * __thiscall
btSpatialMotionVector::operator+=(btSpatialMotionVector *this,btSpatialMotionVector *vec)

{
  btVector3 *in_RSI;
  btSpatialMotionVector *in_RDI;
  
  btVector3::operator+=(&in_RDI->m_topVec,in_RSI);
  btVector3::operator+=(&in_RDI->m_bottomVec,in_RSI + 1);
  return in_RDI;
}

Assistant:

btSpatialMotionVector & operator += (const btSpatialMotionVector &vec) { m_topVec += vec.m_topVec; m_bottomVec += vec.m_bottomVec; return *this; }